

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O1

void virtio_legacy_setup_tx_queue(virtio_device *dev,uint16_t idx)

{
  undefined8 *puVar1;
  size_t size;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ssize_t sVar7;
  void *__s;
  uint *puVar8;
  mempool *pmVar9;
  virtio_device *unaff_RBX;
  int __fd;
  long lVar10;
  uint num_entries;
  dma_memory dVar11;
  ushort auStack_270 [256];
  virtio_device *pvStack_70;
  void *local_68;
  ulong local_60;
  ushort local_56;
  ushort local_54;
  uint16_t local_52;
  ulong local_50;
  void *local_48;
  uintptr_t local_40;
  undefined4 local_34;
  
  if ((ushort)(idx - 3) < 0xfffe) {
    pvStack_70 = (virtio_device *)0x10705a;
    virtio_legacy_setup_tx_queue_cold_5();
    __fd = (int)dev;
LAB_0010705a:
    pvStack_70 = (virtio_device *)0x10705f;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_0010705f:
    pvStack_70 = (virtio_device *)0x107064;
    virtio_legacy_setup_tx_queue_cold_2();
  }
  else {
    __fd = dev->fd;
    pvStack_70 = (virtio_device *)0x106dd8;
    local_52 = idx;
    sVar7 = pwrite(__fd,&local_52,2,0xe);
    unaff_RBX = dev;
    if (sVar7 != 2) goto LAB_0010705a;
    __fd = dev->fd;
    pvStack_70 = (virtio_device *)0x106df9;
    sVar7 = pread(__fd,&local_56,2,0xc);
    if (sVar7 != 2) goto LAB_0010705f;
    local_68 = (void *)CONCAT44(local_68._4_4_,(uint)local_56);
    pvStack_70 = (virtio_device *)0x106e3d;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x37,"virtio_legacy_setup_tx_queue",idx);
    num_entries = (uint)local_56;
    if (local_56 == 0) {
      return;
    }
    local_50 = (ulong)num_entries;
    size = (ulong)(((uint)local_56 + (uint)local_56 * 8) * 2 + 0x1003 & 0x3ff000) + 4 + local_50 * 8
    ;
    pvStack_70 = (virtio_device *)0x106e7b;
    dVar11 = memory_allocate_dma(size,true);
    local_40 = dVar11.phy;
    __s = dVar11.virt;
    pvStack_70 = (virtio_device *)0x106e93;
    memset(__s,0xab,size);
    pvStack_70 = (virtio_device *)0x106ec4;
    local_68 = __s;
    local_48 = __s;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x3e,"virtio_legacy_setup_tx_queue",size);
    __fd = dev->fd;
    local_34 = (undefined4)(local_40 >> 0xc);
    pvStack_70 = (virtio_device *)0x106ee6;
    sVar7 = pwrite(__fd,&local_34,4,8);
    if (sVar7 == 4) {
      pvStack_70 = (virtio_device *)0x106f02;
      puVar8 = (uint *)calloc(1,(ulong)local_56 * 8 + 0x38);
      *puVar8 = num_entries;
      *(void **)(puVar8 + 2) = local_48;
      local_68 = (void *)((ulong)(uint)((int)local_50 << 4) + (long)local_48);
      *(void **)(puVar8 + 4) = local_68;
      local_60 = (long)local_68 + local_50 * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar8 + 6) = local_60;
      pvStack_70 = (virtio_device *)0x106f65;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x44,"virtio_legacy_setup_tx_queue");
      uVar2 = *puVar8;
      if ((ulong)uVar2 != 0) {
        lVar3 = *(long *)(puVar8 + 2);
        lVar4 = *(long *)(puVar8 + 4);
        lVar5 = *(long *)(puVar8 + 6);
        lVar10 = 0;
        do {
          puVar1 = (undefined8 *)(lVar3 + lVar10 * 8);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined2 *)(lVar4 + 4 + lVar10) = 0;
          *(undefined8 *)(lVar5 + 4 + lVar10 * 4) = 0;
          lVar10 = lVar10 + 2;
        } while ((ulong)uVar2 * 2 != lVar10);
      }
      *(undefined2 *)(*(long *)(puVar8 + 6) + 2) = 0;
      *(undefined2 *)(*(long *)(puVar8 + 4) + 2) = 0;
      *(undefined2 *)(puVar8 + 10) = 0;
      __fd = dev->fd;
      pvStack_70 = (virtio_device *)0x106fd5;
      sVar7 = pread(__fd,&local_54,2,0x10);
      if (sVar7 == 2) {
        pvStack_70 = (virtio_device *)0x10700c;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x54,"virtio_legacy_setup_tx_queue",(ulong)local_54);
        *(ulong *)(puVar8 + 8) = (ulong)local_54;
        if (idx == 2) {
          pvStack_70 = (virtio_device *)0x107025;
          pmVar9 = memory_allocate_mempool(num_entries,0x800);
          *(mempool **)(puVar8 + 0xc) = pmVar9;
        }
        **(undefined2 **)(puVar8 + 4) = 1;
        **(undefined2 **)(puVar8 + 6) = 0;
        (&dev->tx_queue)[idx != 1] = puVar8;
        return;
      }
      goto LAB_00107069;
    }
  }
  pvStack_70 = (virtio_device *)0x107069;
  virtio_legacy_setup_tx_queue_cold_3();
LAB_00107069:
  pvStack_70 = (virtio_device *)0x10706e;
  virtio_legacy_setup_tx_queue_cold_4();
  pvStack_70 = unaff_RBX;
  iVar6 = ioctl(__fd,0x3b6c);
  if (iVar6 == -1) {
    vfio_enable_dma_cold_1();
  }
  else {
    auStack_270[0] = 0;
    sVar7 = pread(__fd,auStack_270,2,4);
    if (sVar7 == 2) {
      auStack_270[0] = auStack_270[0] | 4;
      sVar7 = pwrite(__fd,auStack_270,2,4);
      if (sVar7 != 2) {
        __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                      ,0x27,"void vfio_enable_dma(int)");
      }
      return;
    }
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

static void virtio_legacy_setup_tx_queue(struct virtio_device* dev, uint16_t idx) {
	if (idx != 1 && idx != 2) {
		error("Can't setup queue %u as Tx queue", idx);
	}

	// Create virt queue itself - Section 4.1.5.1.3
	write_io16(dev->fd, idx, VIRTIO_PCI_QUEUE_SEL);
	uint32_t max_queue_size = read_io16(dev->fd, VIRTIO_PCI_QUEUE_NUM);
	debug("Max queue size of tx queue #%u: %u", idx, max_queue_size);
	if (max_queue_size == 0) {
		return;
	}
	size_t virt_queue_mem_size = virtio_legacy_vring_size(max_queue_size, 4096);
	struct dma_memory mem = memory_allocate_dma(virt_queue_mem_size, true);
	memset(mem.virt, 0xab, virt_queue_mem_size);
	debug("Allocated %zu bytes for virt queue at %p", virt_queue_mem_size, mem.virt);
	write_io32(dev->fd, mem.phy >> VIRTIO_PCI_QUEUE_ADDR_SHIFT, VIRTIO_PCI_QUEUE_PFN);

	// Section 2.4.2 for layout
	struct virtqueue* vq = calloc(1, sizeof(*vq) + sizeof(void*) * max_queue_size);
	virtio_legacy_vring_init(&vq->vring, max_queue_size, mem.virt, 4096);
	debug("vring desc: %p, vring avail: %p, vring used: %p", vq->vring.desc, vq->vring.avail, vq->vring.used);
	for (size_t i = 0; i < vq->vring.num; ++i) {
		vq->vring.desc[i].len = 0;
		vq->vring.desc[i].addr = 0;
		vq->vring.desc[i].flags = 0;
		vq->vring.desc[i].next = 0;
		vq->vring.avail->ring[i] = 0;
		vq->vring.used->ring[i].id = 0;
		vq->vring.used->ring[i].len = 0;
	}
	vq->vring.used->idx = 0;
	vq->vring.avail->idx = 0;
	vq->vq_used_last_idx = 0;

	// Section 4.1.4.4
	uint32_t notify_offset = read_io16(dev->fd, VIRTIO_PCI_QUEUE_NOTIFY);
	debug("vq notifcation offset %u", notify_offset);
	vq->notification_offset = notify_offset;

	// Ctrl queue packets are not supplied by the user
	if (idx == 2) {
		vq->mempool = memory_allocate_mempool(max_queue_size, 2048);
	}

	// Disable interrupts - Section 2.4.7
	vq->vring.avail->flags = VRING_AVAIL_F_NO_INTERRUPT;
	vq->vring.used->flags = 0;

	if (idx == 1) {
		dev->tx_queue = vq;
	} else {
		dev->ctrl_queue = vq;
	}
}